

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_valence_encoder.h
# Opt level: O0

bool __thiscall
draco::MeshEdgebreakerTraversalValenceEncoder::Init
          (MeshEdgebreakerTraversalValenceEncoder *this,MeshEdgebreakerEncoderImplInterface *encoder
          )

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  size_t sVar4;
  reference pvVar5;
  reference this_00;
  MeshEdgebreakerEncoderImplInterface *in_RSI;
  MeshEdgebreakerTraversalEncoder *in_RDI;
  int32_t num_unique_valences;
  CornerIndex i_1;
  VertexIndex i;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> *in_stack_ffffffffffffffa8;
  pointer *index;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  CornerTable *this_01;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> in_stack_ffffffffffffffcc;
  VertexIndex in_stack_ffffffffffffffd0;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_28;
  uint local_24;
  uint local_20;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_1c;
  MeshEdgebreakerEncoderImplInterface *local_18;
  bool local_1;
  
  local_18 = in_RSI;
  bVar1 = MeshEdgebreakerTraversalEncoder::Init(in_RDI,in_RSI);
  if (bVar1) {
    *(undefined4 *)
     &in_RDI[1].traversal_buffer_.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      field_0xc = 2;
    *(undefined4 *)
     &in_RDI[1].traversal_buffer_.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      field_0x10 = 7;
    iVar2 = (*local_18->_vptr_MeshEdgebreakerEncoderImplInterface[8])();
    in_RDI[1].start_face_encoder_.bit_counts_.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)CONCAT44(extraout_var,iVar2);
    this_01 = (CornerTable *)
              &in_RDI[1].start_face_encoder_.bits_.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
    CornerTable::num_vertices((CornerTable *)0x1a109e);
    IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int>::resize
              ((IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int> *
               )CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               (size_t)in_stack_ffffffffffffffa8);
    IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::IndexType(&local_1c,0);
    while( true ) {
      sVar4 = IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int>::
              size((IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int>
                    *)0x1a10c8);
      local_20 = (uint)sVar4;
      bVar1 = IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::operator<(&local_1c,&local_20);
      if (!bVar1) break;
      local_24 = local_1c.value_;
      in_stack_ffffffffffffffb4 = CornerTable::Valence(this_01,(VertexIndex)(uint)in_RDI);
      pvVar5 = IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int>::
               operator[]((IndexTypeVector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_int>
                           *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                          in_stack_ffffffffffffffa8);
      *pvVar5 = in_stack_ffffffffffffffb4;
      IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::operator++(&local_1c);
    }
    index = &in_RDI[1].start_face_encoder_.bit_counts_.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    CornerTable::num_corners((CornerTable *)0x1a1149);
    IndexTypeVector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>
    ::resize((IndexTypeVector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>
              *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),(size_t)index);
    IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::IndexType(&local_28,0);
    while( true ) {
      uVar3 = CornerTable::num_corners((CornerTable *)0x1a1172);
      bVar1 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator<
                        (&local_28,(uint *)&stack0xffffffffffffffd4);
      if (!bVar1) break;
      in_stack_ffffffffffffffcc.value_ = local_28.value_;
      in_stack_ffffffffffffffd0 = CornerTable::Vertex(this_01,(uint)in_RDI);
      this_00 = IndexTypeVector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>
                ::operator[]((IndexTypeVector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>
                              *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                             (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)index);
      IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::operator=
                (this_00,(ThisIndexType *)&stack0xffffffffffffffd0);
      IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator++(&local_28);
    }
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::resize((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)CONCAT44(uVar3,in_stack_ffffffffffffffd0.value_),
             CONCAT44(in_stack_ffffffffffffffcc.value_,
                      (*(int *)&in_RDI[1].traversal_buffer_.buffer_.
                                super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10 -
                      *(int *)&in_RDI[1].traversal_buffer_.buffer_.
                               super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0xc) +
                      1));
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Init(MeshEdgebreakerEncoderImplInterface *encoder) {
    if (!MeshEdgebreakerTraversalEncoder::Init(encoder)) {
      return false;
    }
    min_valence_ = 2;
    max_valence_ = 7;
    corner_table_ = encoder->GetCornerTable();

    // Initialize valences of all vertices.
    vertex_valences_.resize(corner_table_->num_vertices());
    for (VertexIndex i(0); i < static_cast<uint32_t>(vertex_valences_.size());
         ++i) {
      vertex_valences_[i] = corner_table_->Valence(VertexIndex(i));
    }

    // Replicate the corner to vertex map from the corner table. We need to do
    // this because the map may get updated during encoding because we add new
    // vertices when we encounter split symbols.
    corner_to_vertex_map_.resize(corner_table_->num_corners());
    for (CornerIndex i(0); i < corner_table_->num_corners(); ++i) {
      corner_to_vertex_map_[i] = corner_table_->Vertex(i);
    }
    const int32_t num_unique_valences = max_valence_ - min_valence_ + 1;

    context_symbols_.resize(num_unique_valences);
    return true;
  }